

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O1

void boost::spirit::classic::attributed_action_policy<boost::spirit::classic::nil_t>::
     call<DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessOMatrix,boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>>
               (ProcessOMatrix *actor,
               position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
               *param_2,position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                        *param_3)

{
  iterator_t end;
  undefined1 in_stack_ffffffffffffff18 [64];
  _Alloc_hider in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70 [16];
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_78;
  
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator((position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                       *)&stack0xffffffffffffff20,param_2);
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_78,param_3);
  end._pos.
  super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .file._M_string_length = (size_type)in_stack_ffffffffffffff58._M_p;
  end.super_type.m_iterator.super_type.m_iterator =
       (file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>)
       (file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>)
       in_stack_ffffffffffffff18._0_24_;
  end.
  super_position_policy<boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .m_CharsPerTab = in_stack_ffffffffffffff18._24_4_;
  end._28_4_ = in_stack_ffffffffffffff18._28_4_;
  end._end.super_type.m_iterator = (type)(type)in_stack_ffffffffffffff18._32_24_;
  end._pos.
  super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .file._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff18._56_8_;
  end._pos.
  super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .file.field_2._M_allocated_capacity = in_stack_ffffffffffffff60;
  end._pos.
  super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .file.field_2._8_8_ = in_stack_ffffffffffffff68;
  end._pos.
  super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .line = in_stack_ffffffffffffff70._0_4_;
  end._pos.
  super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._36_4_ = in_stack_ffffffffffffff70._4_4_;
  end._isend = (bool)in_stack_ffffffffffffff70[8];
  end._97_7_ = in_stack_ffffffffffffff70._9_7_;
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessOMatrix::operator()
            (actor,(iterator_t *)&stack0xffffffffffffff20,end);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_78._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_78._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_78._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  detail::shared_count::~shared_count(&local_78._end.super_type.m_iterator.m_mem.pn);
  detail::shared_count::~shared_count
            ((shared_count *)((long)&local_78.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  if (in_stack_ffffffffffffff58._M_p != &stack0xffffffffffffff68) {
    operator_delete(in_stack_ffffffffffffff58._M_p,in_stack_ffffffffffffff68 + 1);
  }
  detail::shared_count::~shared_count((shared_count *)&stack0xffffffffffffff48);
  detail::shared_count::~shared_count((shared_count *)&stack0xffffffffffffff28);
  return;
}

Assistant:

static void
        call(
            ActorT const& actor,
            nil_t,
            IteratorT const& first,
            IteratorT const& last)
        {
            actor(first, last);
        }